

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O2

PmError Pm_Poll(PortMidiStream *stream)

{
  PmError PVar1;
  int iVar2;
  
  pm_hosterror = 0;
  PVar1 = pmBadPtr;
  if (stream != (PortMidiStream *)0x0) {
    if ((descriptors[*stream].pub.opened != 0) && (descriptors[*stream].pub.input != 0)) {
      PVar1 = (**(code **)(*(long *)((long)stream + 0x50) + 0x50))(stream);
      if (PVar1 == pmNoData) {
        iVar2 = Pm_QueueEmpty(*(PmQueue **)((long)stream + 0x20));
        PVar1 = (PmError)(iVar2 == 0);
      }
      else if (PVar1 == pmHostError) {
        (**(code **)(*(long *)((long)stream + 0x50) + 0x60))(stream,pm_hosterror_text,0x100);
        pm_hosterror = 1;
        PVar1 = pmHostError;
      }
    }
  }
  return PVar1;
}

Assistant:

PMEXPORT PmError Pm_Poll( PortMidiStream *stream )
{
    PmInternal *midi = (PmInternal *) stream;
    PmError err;

    pm_hosterror = FALSE;
    /* arg checking */
    if(midi == NULL)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.opened)
        err = pmBadPtr;
    else if (!descriptors[midi->device_id].pub.input)
        err = pmBadPtr;
    else
        err = (*(midi->dictionary->poll))(midi);

    if (err != pmNoError) {
        if (err == pmHostError) {
            midi->dictionary->host_error(midi, pm_hosterror_text, 
                                         PM_HOST_ERROR_MSG_LEN);
           pm_hosterror = TRUE;
        }
        return pm_errmsg(err);
    }

    return (PmError) !Pm_QueueEmpty(midi->queue);
}